

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_rtd(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 addr;
  TCGContext_conflict2 *s_00;
  TCGv_i32 *ppTVar2;
  TCGv_i32 *ppTVar3;
  char cVar4;
  uint32_t uVar5;
  TCGTemp *pTVar6;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar5 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar2 = s->writeback;
  }
  addr = ppTVar2[7];
  uVar1 = ((s->base).tb)->flags;
  s_00 = s->uc->tcg_ctx;
  pTVar6 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  tcg_gen_qemu_ld_i32_m68k
            (s_00,(TCGv_i32)((long)pTVar6 - (long)s_00),addr,(ulong)((uVar1 >> 0xd & 1) == 0),
             MO_BEUL);
  cVar4 = (char)s->writeback_mask;
  if (cVar4 < '\0') {
    ppTVar2 = s->writeback;
  }
  else {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  if (cVar4 < '\0') {
    ppTVar3 = s->writeback;
  }
  else {
    ppTVar3 = s->uc->tcg_ctx->cpu_aregs;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar2[7],ppTVar3[7],(short)uVar5 + 4);
  gen_jmp(s,(TCGv_i32)((long)pTVar6 - (long)s_00));
  return;
}

Assistant:

DISAS_INSN(rtd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;
    int16_t offset = read_im16(env, s);

    tmp = gen_load(s, OS_LONG, QREG_SP, 0, IS_USER(s));
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, QREG_SP, offset + 4);
    gen_jmp(s, tmp);
}